

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.cxx
# Opt level: O0

void __thiscall cmExportSet::cmExportSet(cmExportSet *this,string *name)

{
  string *name_local;
  cmExportSet *this_local;
  
  std::
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  ::vector(&this->TargetExports);
  std::__cxx11::string::string((string *)&this->Name,(string *)name);
  std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>::
  vector(&this->Installations);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  ::map(&this->PackageDependencies);
  this->NextPackageDependencyIndex = 0;
  return;
}

Assistant:

cmExportSet::cmExportSet(std::string name)
  : Name(std::move(name))
{
}